

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O3

bool tinyusdz::detail::ParseMaterialXValue<std::array<float,2ul>>
               (string *str,array<float,_2UL> *value,string *err)

{
  bool bVar1;
  array<float,_2UL> val;
  StreamReader sr;
  AsciiParser parser;
  float2 local_518;
  StreamReader local_510;
  AsciiParser local_4f0;
  
  local_510.binary_ = (uint8_t *)(str->_M_dataplus)._M_p;
  local_510.length_ = str->_M_string_length;
  local_510.swap_endian_ = false;
  local_510.idx_ = 0;
  ascii::AsciiParser::AsciiParser(&local_4f0,&local_510);
  local_518._M_elems[0] = 0.0;
  local_518._M_elems[1] = 0.0;
  bVar1 = ParseValue<std::array<float,2ul>>(&local_4f0,&local_518,err);
  if (bVar1) {
    *&value->_M_elems = local_518._M_elems;
  }
  ascii::AsciiParser::~AsciiParser(&local_4f0);
  return bVar1;
}

Assistant:

bool ParseMaterialXValue(const std::string &str, T *value, std::string *err) {
  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  T val{};

  if (!ParseValue(parser, val, err)) {
    return false;
  }

  (*value) = val;
  return true;
}